

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

char * __thiscall cmsys::RegExpCompile::regbranch(RegExpCompile *this,int *flagp)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  undefined8 in_RAX;
  char *val;
  char *pcVar4;
  int flags;
  undefined8 uStack_38;
  
  *flagp = 0;
  pcVar2 = this->regcode;
  if (pcVar2 == &regdummy) {
    this->regsize = this->regsize + 3;
  }
  else {
    pcVar2[0] = '\x06';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    this->regcode = pcVar2 + 3;
  }
  pcVar4 = (char *)0x0;
  uStack_38 = in_RAX;
  while (((cVar1 = *this->regparse, cVar1 != '\0' && (cVar1 != ')')) && (cVar1 != '|'))) {
    val = regpiece(this,(int *)((long)&uStack_38 + 4));
    if (val == (char *)0x0) {
      return (char *)0x0;
    }
    uVar3 = uStack_38._4_4_ & 1 | *flagp;
    *flagp = uVar3;
    if (pcVar4 == (char *)0x0) {
      *flagp = uVar3 | uStack_38._4_4_ & 4;
      pcVar4 = val;
    }
    else {
      regtail(pcVar4,val);
      pcVar4 = val;
    }
  }
  if (pcVar4 == (char *)0x0) {
    pcVar4 = this->regcode;
    if (pcVar4 == &regdummy) {
      this->regsize = this->regsize + 3;
    }
    else {
      pcVar4[0] = '\t';
      pcVar4[1] = '\0';
      pcVar4[2] = '\0';
      this->regcode = pcVar4 + 3;
    }
  }
  return pcVar2;
}

Assistant:

char* RegExpCompile::regbranch(int* flagp)
{
  char* ret;
  char* chain;
  char* latest;
  int flags;

  *flagp = WORST; // Tentatively.

  ret = regnode(BRANCH);
  chain = nullptr;
  while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
    latest = regpiece(&flags);
    if (latest == nullptr)
      return (nullptr);
    *flagp |= flags & HASWIDTH;
    if (chain == nullptr) // First piece.
      *flagp |= flags & SPSTART;
    else
      regtail(chain, latest);
    chain = latest;
  }
  if (chain == nullptr) // Loop ran zero times.
    regnode(NOTHING);

  return (ret);
}